

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::CumulativeReporterBase::SectionNode::~SectionNode(SectionNode *this)

{
  ~SectionNode(this);
  operator_delete(this);
  return;
}

Assistant:

CumulativeReporterBase::SectionNode::~SectionNode() {}